

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fMultisampleTests.cpp
# Opt level: O1

void __thiscall deqp::gles2::Functional::LineNumSamplesCase::renderPattern(LineNumSamplesCase *this)

{
  int i;
  long lVar1;
  int iVar2;
  int iVar3;
  float fVar4;
  float fVar5;
  Vec2 local_50;
  Vec2 local_48;
  Vec4 local_40;
  
  fVar4 = (float)(this->super_NumSamplesCase).super_MultisampleCase.m_viewportSize * 0.00390625;
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  iVar2 = (int)(fVar4 * 100.0);
  if (0 < iVar2) {
    iVar3 = 0;
    do {
      fVar4 = (float)(this->super_NumSamplesCase).m_currentIteration * 0.001 +
              ((float)iVar3 * 6.2831855) / (float)iVar2;
      local_48.m_data[0] = 0.0;
      local_48.m_data[1] = 0.0;
      fVar5 = cosf(fVar4);
      local_50.m_data[1] = sinf(fVar4);
      local_50.m_data[1] = local_50.m_data[1] * 0.95;
      lVar1 = 0;
      do {
        local_40.m_data[lVar1] = 1.0;
        lVar1 = lVar1 + 1;
      } while (lVar1 != 4);
      local_50.m_data[0] = fVar5 * 0.95;
      MultisampleCase::renderLine((MultisampleCase *)this,&local_48,&local_50,&local_40);
      iVar3 = iVar3 + 1;
    } while (iVar3 != iVar2);
  }
  return;
}

Assistant:

void LineNumSamplesCase::renderPattern (void) const
{
	// The test pattern consists of several lines at different angles.

	// We scale the number of lines based on the viewport size. This is because a gl line's thickness is
	// constant in pixel units, i.e. they get relatively thicker as viewport size decreases. Thus we must
	// decrease the number of lines in order to decrease the extent of overlap among the lines in the
	// center of the pattern.
	const int numLines = (int)(100.0f * deFloatSqrt((float)m_viewportSize / 256.0f));

	for (int i = 0; i < numLines; i++)
	{
		float angle = 2.0f*DE_PI * (float)i / (float)numLines + 0.001f*(float)m_currentIteration;
		renderLine(Vec2(0.0f, 0.0f), Vec2(deFloatCos(angle)*0.95f, deFloatSin(angle)*0.95f), Vec4(1.0f));
	}
}